

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeBuffer.cpp
# Opt level: O1

void __thiscall cali::NodeBuffer::append(NodeBuffer *this,NodeInfo *info)

{
  cali_id_t cVar1;
  bool bVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  void *__src;
  byte bVar7;
  ulong uVar8;
  long lVar9;
  byte *pbVar10;
  long lVar11;
  ulong uVar12;
  uchar *puVar13;
  uchar *puVar14;
  
  sVar6 = this->m_pos;
  sVar4 = cali_variant_get_size((info->value).m_v);
  reserve(this,sVar6 + sVar4 + 0x32);
  puVar14 = this->m_buffer + this->m_pos;
  cVar1 = info->parent_id;
  uVar12 = (ulong)(cVar1 != 0xffffffffffffffff) + info->node_id * 2;
  lVar5 = 1;
  if (info->node_id * 2 < 0x80) {
    lVar9 = 1;
    puVar13 = puVar14;
  }
  else {
    lVar9 = 0;
    uVar8 = uVar12;
    do {
      lVar11 = lVar9;
      puVar14[lVar11] = (byte)uVar8 | 0x80;
      uVar12 = uVar8 >> 7;
      bVar2 = 0x3fff < uVar8;
      lVar9 = lVar11 + 1;
      uVar8 = uVar12;
    } while (bVar2);
    lVar9 = lVar11 + 2;
    puVar13 = puVar14 + lVar11 + 1;
  }
  *puVar13 = (uchar)uVar12;
  uVar12 = info->attr_id;
  puVar13 = puVar14 + lVar9;
  if (0x7f < uVar12) {
    lVar11 = 0;
    uVar8 = uVar12;
    do {
      lVar5 = lVar11;
      puVar13[lVar5] = (byte)uVar8 | 0x80;
      uVar12 = uVar8 >> 7;
      bVar2 = 0x3fff < uVar8;
      lVar11 = lVar5 + 1;
      uVar8 = uVar12;
    } while (bVar2);
    puVar13 = puVar13 + lVar5 + 1;
    lVar5 = lVar5 + 2;
  }
  lVar5 = lVar5 + lVar9;
  *puVar13 = (uchar)uVar12;
  if (cVar1 != 0xffffffffffffffff) {
    uVar12 = info->parent_id;
    puVar13 = puVar14 + lVar5;
    lVar9 = 1;
    if (0x7f < uVar12) {
      uVar8 = uVar12;
      lVar11 = 0;
      do {
        lVar9 = lVar11;
        puVar13[lVar9] = (byte)uVar8 | 0x80;
        uVar12 = uVar8 >> 7;
        bVar2 = 0x3fff < uVar8;
        uVar8 = uVar12;
        lVar11 = lVar9 + 1;
      } while (bVar2);
      puVar13 = puVar13 + lVar9 + 1;
      lVar9 = lVar9 + 2;
    }
    *puVar13 = (uchar)uVar12;
    lVar5 = lVar5 + lVar9;
  }
  bVar7 = (byte)(info->value).m_v.type_and_size;
  pbVar10 = puVar14 + lVar5;
  lVar9 = 1;
  if (bVar7 < 0x80) {
    lVar11 = 1;
  }
  else {
    *pbVar10 = bVar7 | 0x80;
    bVar7 = bVar7 >> 7;
    pbVar10 = pbVar10 + 1;
    lVar11 = 2;
  }
  *pbVar10 = bVar7;
  sVar6 = cali_variant_get_size((info->value).m_v);
  puVar13 = puVar14 + lVar11 + lVar5;
  if (0x7f < sVar6) {
    sVar4 = sVar6;
    lVar3 = 0;
    do {
      lVar9 = lVar3;
      puVar13[lVar9] = (byte)sVar4 | 0x80;
      sVar6 = sVar4 >> 7;
      bVar2 = 0x3fff < sVar4;
      sVar4 = sVar6;
      lVar3 = lVar9 + 1;
    } while (bVar2);
    puVar13 = puVar13 + lVar9 + 1;
    lVar9 = lVar9 + 2;
  }
  *puVar13 = (uchar)sVar6;
  lVar9 = lVar9 + lVar11 + lVar5;
  __src = cali_variant_get_data(&(info->value).m_v);
  sVar6 = cali_variant_get_size((info->value).m_v);
  memcpy(puVar14 + lVar9,__src,sVar6);
  sVar6 = cali_variant_get_size((info->value).m_v);
  this->m_pos = this->m_pos + sVar6 + lVar9;
  this->m_count = this->m_count + 1;
  return;
}

Assistant:

void NodeBuffer::append(const NodeInfo& info)
{
    reserve(m_pos + max_packed_size(info));

    m_pos += ::pack_node(m_buffer + m_pos, info);
    ++m_count;
}